

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefValue.cpp
# Opt level: O2

double BeliefValue::GetValue
                 (BeliefInterface *Belief,ValueFunctionPOMDPDiscrete *V,
                 vector<bool,_std::allocator<bool>_> *mask)

{
  const_reference cVar1;
  E *this;
  pointer pAVar2;
  pointer pAVar3;
  uint uVar4;
  ulong __n;
  double dVar5;
  double local_30;
  
  pAVar3 = (V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pAVar2 = (V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((ulong)(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p -
      (long)(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p) * 8 == ((long)pAVar2 - (long)pAVar3) / 0x28) {
    dVar5 = -1.79769313486232e+308;
    uVar4 = 0;
    local_30 = -1.79769313486232e+308;
    while (__n = (ulong)uVar4, ((long)pAVar2 - (long)pAVar3) / 0x28 != __n) {
      cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](mask,__n);
      if (cVar1) {
        (*Belief->_vptr_BeliefInterface[0x10])
                  (Belief,&(V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>).
                           _M_impl.super__Vector_impl_data._M_start[__n]._m_values);
        if (local_30 < dVar5) {
          local_30 = dVar5;
        }
      }
      pAVar3 = (V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = uVar4 + 1;
      pAVar2 = (V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
    return local_30;
  }
  this = (E *)__cxa_allocate_exception(0x28,pAVar3,((long)pAVar2 - (long)pAVar3) % 0x28);
  E::E(this,"BeliefValue::GetValue: mask has incorrect size");
  __cxa_throw(this,&E::typeinfo,E::~E);
}

Assistant:

double BeliefValue::GetValue(const BeliefInterface &Belief,
                             const ValueFunctionPOMDPDiscrete &V,
                             const vector<bool> mask)
{
    double x,maxVal=-DBL_MAX;
    bool maskValid=false;

    if(mask.size()!=V.size())
    {
        throw(E("BeliefValue::GetValue: mask has incorrect size"));
    }

    for(unsigned int i=0;i!=V.size();i++)
    {
        if(mask[i])
        {
            maskValid=true;
            // compute inner product of belief with vector
            x=Belief.InnerProduct(V[i].GetValues());
        
            // keep the maximizing value
            if(x>maxVal)
                maxVal=x;
        }
    }

    return(maxVal);
}